

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * Strsafe(char *y)

{
  char cVar1;
  char *data;
  size_t sVar2;
  long lVar3;
  
  if (y == (char *)0x0) {
    data = (char *)0x0;
  }
  else {
    data = Strsafe_find(y);
    if (data == (char *)0x0) {
      sVar2 = strlen(y);
      data = (char *)lemon_malloc((long)((int)sVar2 + 1));
      lVar3 = 0;
      do {
        cVar1 = y[lVar3];
        data[lVar3] = cVar1;
        lVar3 = lVar3 + 1;
      } while (cVar1 != '\0');
      Strsafe_insert(data);
    }
  }
  return data;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)lemon_malloc( lemonStrlen(y)+1 ))!=0 ){
    lemon_strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}